

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O1

void __thiscall QAbstractItemView::~QAbstractItemView(QAbstractItemView *this)

{
  QAbstractItemViewPrivate *this_00;
  
  *(undefined ***)this = &PTR_metaObject_00819080;
  *(undefined ***)(this + 0x10) = &PTR__QAbstractItemView_00819390;
  this_00 = *(QAbstractItemViewPrivate **)(this + 8);
  QBasicTimer::stop();
  QBasicTimer::stop();
  QBasicTimer::stop();
  QBasicTimer::stop();
  QBasicTimer::stop();
  QBasicTimer::stop();
  QBasicTimer::stop();
  QAbstractItemViewPrivate::disconnectAll(this_00);
  QAbstractScrollArea::~QAbstractScrollArea((QAbstractScrollArea *)this);
  return;
}

Assistant:

QAbstractItemView::~QAbstractItemView()
{
    Q_D(QAbstractItemView);
    // stop these timers here before ~QObject
    d->delayedReset.stop();
    d->updateTimer.stop();
    d->delayedEditing.stop();
    d->delayedAutoScroll.stop();
    d->autoScrollTimer.stop();
    d->delayedLayout.stop();
    d->fetchMoreTimer.stop();
    d->disconnectAll();
}